

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcherStack.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XPathMatcherStack::XPathMatcherStack(XPathMatcherStack *this,MemoryManager *manager)

{
  ValueStackOf<int> *this_00;
  RefVectorOf<xercesc_4_0::XPathMatcher> *this_01;
  OutOfMemoryException *anon_var_0;
  undefined1 local_30 [8];
  CleanupType_conflict27 cleanup;
  MemoryManager *manager_local;
  XPathMatcherStack *this_local;
  
  cleanup._16_8_ = manager;
  XMemory::XMemory((XMemory *)this);
  this->fMatchersCount = 0;
  this->fContextStack = (ValueStackOf<int> *)0x0;
  this->fMatchers = (RefVectorOf<xercesc_4_0::XPathMatcher> *)0x0;
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcherStack> *)local_30,this,(MFPT)cleanUp);
  this_00 = (ValueStackOf<int> *)XMemory::operator_new(0x30,(MemoryManager *)cleanup._16_8_);
  ValueStackOf<int>::ValueStackOf(this_00,8,(MemoryManager *)cleanup._16_8_,false);
  this->fContextStack = this_00;
  this_01 = (RefVectorOf<xercesc_4_0::XPathMatcher> *)
            XMemory::operator_new(0x30,(MemoryManager *)cleanup._16_8_);
  RefVectorOf<xercesc_4_0::XPathMatcher>::RefVectorOf
            (this_01,8,true,(MemoryManager *)cleanup._16_8_);
  this->fMatchers = this_01;
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack>::release
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcherStack> *)local_30);
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XPathMatcherStack> *)local_30);
  return;
}

Assistant:

XPathMatcherStack::XPathMatcherStack(MemoryManager* const manager)
    : fMatchersCount(0)
    , fContextStack(0)
    , fMatchers(0)
{
    CleanupType cleanup(this, &XPathMatcherStack::cleanUp);

    try {
        fContextStack = new (manager) ValueStackOf<int>(8, manager);
        fMatchers = new (manager) RefVectorOf<XPathMatcher>(8, true, manager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}